

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O1

int __thiscall Samba::connect(Samba *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  SerialPort *pSVar1;
  SerialPort *pSVar2;
  int iVar3;
  undefined8 unaff_RBP;
  undefined7 uVar4;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *pEVar5;
  
  pSVar1 = *(SerialPort **)CONCAT44(in_register_00000034,__fd);
  *(undefined8 *)CONCAT44(in_register_00000034,__fd) = 0;
  pSVar2 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
  super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
  super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl = pSVar1;
  if (pSVar2 != (SerialPort *)0x0) {
    (*pSVar2->_vptr_SerialPort[1])();
  }
  iVar3 = (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[4])();
  this->_isUsb = SUB41(iVar3,0);
  uVar4 = (undefined7)((ulong)unaff_RBP >> 8);
  if (SUB41(iVar3,0) != false) {
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    pEVar5 = (EVP_PKEY_CTX *)0xe1000;
    iVar3 = (*pSVar1->_vptr_SerialPort[2])(pSVar1,0xe1000,8,0,0);
    if (((char)iVar3 != '\0') && (iVar3 = init(this,pEVar5), (char)iVar3 != '\0')) {
      iVar3 = (int)CONCAT71(uVar4,1);
      if (this->_debug != true) {
        return iVar3;
      }
      puts("Connected at 921600 baud");
      return iVar3;
    }
    (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
       super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
       super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[3])();
  }
  this->_isUsb = false;
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  pEVar5 = (EVP_PKEY_CTX *)((ulong)__addr & 0xffffffff);
  iVar3 = (*pSVar1->_vptr_SerialPort[2])(pSVar1,pEVar5,8,0,0);
  if (((char)iVar3 != '\0') && (iVar3 = init(this,pEVar5), (char)iVar3 != '\0')) {
    iVar3 = (int)CONCAT71(uVar4,1);
    if (this->_debug != true) {
      return iVar3;
    }
    printf("Connected at %d baud\n",(ulong)__addr & 0xffffffff);
    return iVar3;
  }
  (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
     super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
     super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[3])();
  (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
  super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
  super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl = (SerialPort *)0x0;
  return 0;
}

Assistant:

bool
Samba::connect(SerialPort::Ptr port, int bps)
{
    _port = move(port);

    // Try to connect at a high speed if USB
    _isUsb = _port->isUsb();
    if (_isUsb)
    {
        if (_port->open(921600) && init())
        {
            if (_debug)
                printf("Connected at 921600 baud\n");
            return true;
        }
        else
        {
            _port->close();
        }
    }
    _isUsb = false;

    // Try the serial port at slower speed
    if (_port->open(bps) && init())
    {
        if (_debug)
            printf("Connected at %d baud\n", bps);
        return true;
    }

    disconnect();
    return false;
}